

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofNonZeroTest_Test::TestBody
          (NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofNonZeroTest_Test *this)

{
  allocator<const_google::protobuf::FieldDescriptor_*> *this_00;
  Reflection *pRVar1;
  Descriptor *pDVar2;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l_00;
  NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofNonZeroTest_Test *s;
  bool bVar3;
  OneofFieldCase OVar4;
  TestAllTypes *this_01;
  Arena *arena;
  char *pcVar5;
  FieldDescriptor *pFVar6;
  string *psVar7;
  char *in_R9;
  AssertHelper local_3b0;
  Message local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_3;
  Message local_388;
  int local_380;
  uint32_t local_37c;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_348;
  Message local_340;
  string_view local_338;
  bool local_321;
  undefined1 local_320 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_2f0;
  Message local_2e8;
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_2a8;
  Message local_2a0;
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_260;
  Message local_258;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar__4;
  FieldDescriptor *local_230;
  iterator local_228;
  size_type local_220;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_218;
  AssertHelper local_200;
  Message local_1f8;
  int local_1f0;
  uint32_t local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_1;
  Message local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_198;
  Message local_190;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_150;
  Message local_148;
  string_view local_140;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_f8;
  Message local_f0;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_b0;
  Message local_a8;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  allocator<const_google::protobuf::FieldDescriptor_*> local_71;
  FieldDescriptor *local_70;
  iterator local_68;
  size_type local_60;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_58;
  string_view local_40;
  FieldDescriptor *local_30;
  FieldDescriptor *f;
  NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofNonZeroTest_Test *this_local;
  TestAllTypes *local_18;
  anon_union_672_1_493b367e_for_TestAllTypes_10 *local_10;
  
  f = (FieldDescriptor *)this;
  proto2_nofieldpresence_unittest::TestAllTypes::set_oneof_uint32
            (&(this->super_NoFieldPresenceSwapFieldTest).m1_,1);
  this_01 = &(this->super_NoFieldPresenceSwapFieldTest).m2_;
  this_local = (NoFieldPresenceSwapFieldTest_ReflectionSwapFieldOneofNonZeroTest_Test *)0x21355a8;
  local_10 = &(this->super_NoFieldPresenceSwapFieldTest).m2_.field_0;
  local_18 = this_01;
  OVar4 = proto2_nofieldpresence_unittest::TestAllTypes::oneof_field_case(this_01);
  if (OVar4 != kOneofString) {
    proto2_nofieldpresence_unittest::TestAllTypes::clear_oneof_field(this_01);
    proto2_nofieldpresence_unittest::TestAllTypes::set_has_oneof_string(this_01);
    internal::ArenaStringPtr::InitDefault
              (&(this->super_NoFieldPresenceSwapFieldTest).m2_.field_0._impl_.oneof_field_.
                oneof_string_);
  }
  s = this_local;
  arena = protobuf::MessageLite::GetArena((MessageLite *)this_01);
  internal::ArenaStringPtr::Set
            (&(this->super_NoFieldPresenceSwapFieldTest).m2_.field_0._impl_.oneof_field_.
              oneof_string_,(char *)s,arena);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"oneof_uint32")
  ;
  local_70 = NoFieldPresenceSwapFieldTest::FindFieldByName
                       (&this->super_NoFieldPresenceSwapFieldTest,local_40);
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r1_;
  local_68 = &local_70;
  local_60 = 1;
  local_30 = local_70;
  std::allocator<const_google::protobuf::FieldDescriptor_*>::allocator(&local_71);
  __l_00._M_len = local_60;
  __l_00._M_array = local_68;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&local_58,__l_00,&local_71);
  Reflection::SwapFields
            (pRVar1,&(this->super_NoFieldPresenceSwapFieldTest).m1_.super_Message,
             &(this->super_NoFieldPresenceSwapFieldTest).m2_.super_Message,&local_58);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector(&local_58);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::~allocator(&local_71);
  local_99 = proto2_nofieldpresence_unittest::TestAllTypes::has_oneof_string
                       (&(this->super_NoFieldPresenceSwapFieldTest).m1_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar3) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_98,
               (AssertionResult *)"m1_.has_oneof_string()","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x24f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_e1 = proto2_nofieldpresence_unittest::TestAllTypes::has_oneof_uint32
                       (&(this->super_NoFieldPresenceSwapFieldTest).m2_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar3) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_e0,
               (AssertionResult *)"m2_.has_oneof_uint32()","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x250,pcVar5);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r1_;
  pDVar2 = (this->super_NoFieldPresenceSwapFieldTest).d1_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_140,"oneof_string");
  pFVar6 = Descriptor::FindFieldByName(pDVar2,local_140);
  local_129 = Reflection::HasField
                        (pRVar1,&(this->super_NoFieldPresenceSwapFieldTest).m1_.super_Message,pFVar6
                        );
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar3) {
    testing::Message::Message(&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_128,
               (AssertionResult *)"r1_->HasField(m1_, d1_->FindFieldByName(\"oneof_string\"))",
               "false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x251,pcVar5);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  local_181 = Reflection::HasField
                        ((this->super_NoFieldPresenceSwapFieldTest).r2_,
                         &(this->super_NoFieldPresenceSwapFieldTest).m2_.super_Message,local_30);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_180,&local_181,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar3) {
    testing::Message::Message(&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_180,
               (AssertionResult *)"r2_->HasField(m2_, f)","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x252,pcVar5);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  psVar7 = proto2_nofieldpresence_unittest::TestAllTypes::oneof_string_abi_cxx11_
                     (&(this->super_NoFieldPresenceSwapFieldTest).m1_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_1c8,"m1_.oneof_string()","\"test\"",psVar7,(char (*) [5])0x21355a8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar3) {
    testing::Message::Message(&local_1d0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x253,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  local_1ec = proto2_nofieldpresence_unittest::TestAllTypes::oneof_uint32
                        (&(this->super_NoFieldPresenceSwapFieldTest).m2_);
  local_1f0 = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_1e8,"m2_.oneof_uint32()","1",&local_1ec,&local_1f0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar3) {
    testing::Message::Message(&local_1f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x254,pcVar5);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r2_;
  local_230 = local_30;
  local_228 = &local_230;
  local_220 = 1;
  this_00 = (allocator<const_google::protobuf::FieldDescriptor_*> *)
            ((long)&gtest_ar__4.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::allocator(this_00);
  __l._M_len = local_220;
  __l._M_array = local_228;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&local_218,__l,this_00);
  Reflection::SwapFields
            (pRVar1,&(this->super_NoFieldPresenceSwapFieldTest).m1_.super_Message,
             &(this->super_NoFieldPresenceSwapFieldTest).m2_.super_Message,&local_218);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector(&local_218);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::~allocator
            ((allocator<const_google::protobuf::FieldDescriptor_*> *)
             ((long)&gtest_ar__4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_249 = proto2_nofieldpresence_unittest::TestAllTypes::has_oneof_uint32
                        (&(this->super_NoFieldPresenceSwapFieldTest).m1_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_248,&local_249,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar3) {
    testing::Message::Message(&local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_248,
               (AssertionResult *)"m1_.has_oneof_uint32()","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x25b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  local_291 = proto2_nofieldpresence_unittest::TestAllTypes::has_oneof_string
                        (&(this->super_NoFieldPresenceSwapFieldTest).m2_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_290,&local_291,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar3) {
    testing::Message::Message(&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_290,
               (AssertionResult *)"m2_.has_oneof_string()","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x25c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  local_2d9 = Reflection::HasField
                        ((this->super_NoFieldPresenceSwapFieldTest).r1_,
                         &(this->super_NoFieldPresenceSwapFieldTest).m1_.super_Message,local_30);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar3) {
    testing::Message::Message(&local_2e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_2d8,
               (AssertionResult *)"r1_->HasField(m1_, f)","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x25d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r2_;
  pDVar2 = (this->super_NoFieldPresenceSwapFieldTest).d2_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_338,"oneof_string");
  pFVar6 = Descriptor::FindFieldByName(pDVar2,local_338);
  local_321 = Reflection::HasField
                        (pRVar1,&(this->super_NoFieldPresenceSwapFieldTest).m2_.super_Message,pFVar6
                        );
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_320,&local_321,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar3) {
    testing::Message::Message(&local_340);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_320,
               (AssertionResult *)"r2_->HasField(m2_, d2_->FindFieldByName(\"oneof_string\"))",
               "false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x25e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  local_37c = proto2_nofieldpresence_unittest::TestAllTypes::oneof_uint32
                        (&(this->super_NoFieldPresenceSwapFieldTest).m1_);
  local_380 = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_378,"m1_.oneof_uint32()","1",&local_37c,&local_380);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar3) {
    testing::Message::Message(&local_388);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x25f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  psVar7 = proto2_nofieldpresence_unittest::TestAllTypes::oneof_string_abi_cxx11_
                     (&(this->super_NoFieldPresenceSwapFieldTest).m2_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_3a0,"m2_.oneof_string()","\"test\"",psVar7,(char (*) [5])0x21355a8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar3) {
    testing::Message::Message(&local_3a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x260,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  return;
}

Assistant:

TEST_F(NoFieldPresenceSwapFieldTest, ReflectionSwapFieldOneofNonZeroTest) {
  m1_.set_oneof_uint32(1);
  m2_.set_oneof_string("test");

  const FieldDescriptor* f = FindFieldByName("oneof_uint32");
  r1_->SwapFields(&m1_, &m2_, /*fields=*/{f});

  // Fields should be swapped.
  EXPECT_TRUE(m1_.has_oneof_string());
  EXPECT_TRUE(m2_.has_oneof_uint32());
  EXPECT_TRUE(r1_->HasField(m1_, d1_->FindFieldByName("oneof_string")));
  EXPECT_TRUE(r2_->HasField(m2_, f));
  EXPECT_EQ(m1_.oneof_string(), "test");
  EXPECT_EQ(m2_.oneof_uint32(), 1);

  // It doesn't matter which reflection or descriptor gets used; swapping should
  // still work if m2_'s descriptor is provided.
  r2_->SwapFields(&m1_, &m2_, /*fields=*/{f});

  // Fields should be swapped.
  EXPECT_TRUE(m1_.has_oneof_uint32());
  EXPECT_TRUE(m2_.has_oneof_string());
  EXPECT_TRUE(r1_->HasField(m1_, f));
  EXPECT_TRUE(r2_->HasField(m2_, d2_->FindFieldByName("oneof_string")));
  EXPECT_EQ(m1_.oneof_uint32(), 1);
  EXPECT_EQ(m2_.oneof_string(), "test");
}